

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicHeap.hpp
# Opt level: O2

void __thiscall
Lib::
DynamicHeap<unsigned_int,_DP::SimpleCongruenceClosure::ConstOrderingComparator,_Lib::ArrayMap<unsigned_int>,_unsigned_int>
::fixDecrease1(DynamicHeap<unsigned_int,_DP::SimpleCongruenceClosure::ConstOrderingComparator,_Lib::ArrayMap<unsigned_int>,_unsigned_int>
               *this,size_t idx)

{
  bool bVar1;
  ulong idxA;
  
  while( true ) {
    if (idx < 2) {
      return;
    }
    idxA = idx >> 1;
    bVar1 = isGreater1(this,idxA,idx);
    if (!bVar1) break;
    swapInHeap1(this,idx,idxA);
    idx = idxA;
  }
  return;
}

Assistant:

void fixDecrease1(size_t idx)
  {
    ASS_G(idx, 0);
    ASS_LE(idx, size());

    while(idx>1) {
      size_t parent = idx/2;
      if(!isGreater1(parent, idx)) {
	break;
      }
      swapInHeap1(idx, parent);
      idx = parent;
    }
  }